

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O0

void __thiscall
t_ocaml_generator::generate_service_interface(t_ocaml_generator *this,t_service *tservice)

{
  bool bVar1;
  ostream *poVar2;
  t_service *ptVar3;
  vector<t_function_*,_std::allocator<t_function_*>_> *__x;
  reference pptVar4;
  string *psVar5;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  undefined1 local_d8 [8];
  string ft;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_a8;
  iterator f_iter;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string extends;
  string local_38;
  t_service *local_18;
  t_service *tservice_local;
  t_ocaml_generator *this_local;
  
  local_18 = tservice;
  tservice_local = (t_service *)this;
  t_generator::indent_abi_cxx11_(&local_38,(t_generator *)this);
  poVar2 = std::operator<<((ostream *)&this->f_service_,(string *)&local_38);
  poVar2 = std::operator<<(poVar2,"class virtual iface =");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"object (self)");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_38);
  t_generator::indent_abi_cxx11_((string *)(extends.field_2._M_local_buf + 8),(t_generator *)this);
  poVar2 = std::operator<<((ostream *)&this->f_service_i_,
                           (string *)(extends.field_2._M_local_buf + 8));
  poVar2 = std::operator<<(poVar2,"class virtual iface :");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"object");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)(extends.field_2._M_local_buf + 8));
  t_generator::indent_up((t_generator *)this);
  ptVar3 = t_service::get_extends(local_18);
  if (ptVar3 != (t_service *)0x0) {
    ptVar3 = t_service::get_extends(local_18);
    type_name_abi_cxx11_
              ((string *)
               &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,this,&ptVar3->super_t_type);
    poVar2 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar2 = std::operator<<(poVar2,"inherit ");
    poVar2 = std::operator<<(poVar2,(string *)
                                    &functions.
                                     super__Vector_base<t_function_*,_std::allocator<t_function_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar2 = std::operator<<(poVar2,".iface");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    poVar2 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_i_);
    poVar2 = std::operator<<(poVar2,"inherit ");
    poVar2 = std::operator<<(poVar2,(string *)
                                    &functions.
                                     super__Vector_base<t_function_*,_std::allocator<t_function_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar2 = std::operator<<(poVar2,".iface");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string
              ((string *)
               &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  __x = t_service::get_functions(local_18);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter,__x);
  __gnu_cxx::
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
  __normal_iterator(&local_a8);
  local_a8._M_current =
       (t_function **)
       std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                 ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  while( true ) {
    ft.field_2._8_8_ =
         std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
    bVar1 = __gnu_cxx::operator!=
                      (&local_a8,
                       (__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                        *)((long)&ft.field_2 + 8));
    if (!bVar1) break;
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_a8);
    function_type_abi_cxx11_((string *)local_d8,this,*pptVar4,true,true);
    t_generator::indent_abi_cxx11_(&local_f8,(t_generator *)this);
    poVar2 = std::operator<<((ostream *)&this->f_service_,(string *)&local_f8);
    poVar2 = std::operator<<(poVar2,"method virtual ");
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_a8);
    psVar5 = t_function::get_name_abi_cxx11_(*pptVar4);
    std::__cxx11::string::string((string *)&local_138,(string *)psVar5);
    t_generator::decapitalize(&local_118,(t_generator *)this,&local_138);
    poVar2 = std::operator<<(poVar2,(string *)&local_118);
    poVar2 = std::operator<<(poVar2," : ");
    poVar2 = std::operator<<(poVar2,(string *)local_d8);
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_f8);
    t_generator::indent_abi_cxx11_(&local_158,(t_generator *)this);
    poVar2 = std::operator<<((ostream *)&this->f_service_i_,(string *)&local_158);
    poVar2 = std::operator<<(poVar2,"method virtual ");
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_a8);
    psVar5 = t_function::get_name_abi_cxx11_(*pptVar4);
    std::__cxx11::string::string((string *)&local_198,(string *)psVar5);
    t_generator::decapitalize(&local_178,(t_generator *)this,&local_198);
    poVar2 = std::operator<<(poVar2,(string *)&local_178);
    poVar2 = std::operator<<(poVar2," : ");
    poVar2 = std::operator<<(poVar2,(string *)local_d8);
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)local_d8);
    __gnu_cxx::
    __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
    operator++(&local_a8);
  }
  t_generator::indent_down((t_generator *)this);
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar2 = std::operator<<(poVar2,"end");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_i_);
  poVar2 = std::operator<<(poVar2,"end");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::~vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  return;
}

Assistant:

void t_ocaml_generator::generate_service_interface(t_service* tservice) {
  f_service_ << indent() << "class virtual iface =" << endl << "object (self)" << endl;
  f_service_i_ << indent() << "class virtual iface :" << endl << "object" << endl;

  indent_up();

  if (tservice->get_extends() != nullptr) {
    string extends = type_name(tservice->get_extends());
    indent(f_service_) << "inherit " << extends << ".iface" << endl;
    indent(f_service_i_) << "inherit " << extends << ".iface" << endl;
  }

  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    string ft = function_type(*f_iter, true, true);
    f_service_ << indent() << "method virtual " << decapitalize((*f_iter)->get_name()) << " : "
               << ft << endl;
    f_service_i_ << indent() << "method virtual " << decapitalize((*f_iter)->get_name()) << " : "
                 << ft << endl;
  }
  indent_down();
  indent(f_service_) << "end" << endl << endl;
  indent(f_service_i_) << "end" << endl << endl;
}